

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

long xmlGetLineNoInternal(xmlNode *node,int depth)

{
  xmlNode *local_28;
  long result;
  int depth_local;
  xmlNode *node_local;
  
  local_28 = (xmlNode *)0xffffffffffffffff;
  if (depth < 5) {
    if (node == (xmlNode *)0x0) {
      node_local = (xmlNode *)0xffffffffffffffff;
    }
    else {
      if ((((node->type == XML_ELEMENT_NODE) || (node->type == XML_TEXT_NODE)) ||
          (node->type == XML_COMMENT_NODE)) || (node->type == XML_PI_NODE)) {
        if (node->line == 0xffff) {
          if ((node->type == XML_TEXT_NODE) && (node->psvi != (void *)0x0)) {
            local_28 = (xmlNode *)node->psvi;
          }
          else if ((node->type == XML_ELEMENT_NODE) && (node->children != (_xmlNode *)0x0)) {
            local_28 = (xmlNode *)xmlGetLineNoInternal(node->children,depth + 1);
          }
          else if (node->next == (_xmlNode *)0x0) {
            if (node->prev != (_xmlNode *)0x0) {
              local_28 = (xmlNode *)xmlGetLineNoInternal(node->prev,depth + 1);
            }
          }
          else {
            local_28 = (xmlNode *)xmlGetLineNoInternal(node->next,depth + 1);
          }
        }
        if ((local_28 == (xmlNode *)0xffffffffffffffff) || (local_28 == (xmlNode *)0xffff)) {
          local_28 = (xmlNode *)(ulong)node->line;
        }
      }
      else if ((node->prev == (_xmlNode *)0x0) ||
              ((((node->prev->type != XML_ELEMENT_NODE && (node->prev->type != XML_TEXT_NODE)) &&
                (node->prev->type != XML_COMMENT_NODE)) && (node->prev->type != XML_PI_NODE)))) {
        if ((node->parent != (_xmlNode *)0x0) && (node->parent->type == XML_ELEMENT_NODE)) {
          local_28 = (xmlNode *)xmlGetLineNoInternal(node->parent,depth + 1);
        }
      }
      else {
        local_28 = (xmlNode *)xmlGetLineNoInternal(node->prev,depth + 1);
      }
      node_local = local_28;
    }
  }
  else {
    node_local = (xmlNode *)0xffffffffffffffff;
  }
  return (long)node_local;
}

Assistant:

static long
xmlGetLineNoInternal(const xmlNode *node, int depth)
{
    long result = -1;

    if (depth >= 5)
        return(-1);

    if (!node)
        return result;
    if ((node->type == XML_ELEMENT_NODE) ||
        (node->type == XML_TEXT_NODE) ||
	(node->type == XML_COMMENT_NODE) ||
	(node->type == XML_PI_NODE)) {
	if (node->line == 65535) {
	    if ((node->type == XML_TEXT_NODE) && (node->psvi != NULL))
	        result = (long) (ptrdiff_t) node->psvi;
	    else if ((node->type == XML_ELEMENT_NODE) &&
	             (node->children != NULL))
	        result = xmlGetLineNoInternal(node->children, depth + 1);
	    else if (node->next != NULL)
	        result = xmlGetLineNoInternal(node->next, depth + 1);
	    else if (node->prev != NULL)
	        result = xmlGetLineNoInternal(node->prev, depth + 1);
	}
	if ((result == -1) || (result == 65535))
	    result = (long) node->line;
    } else if ((node->prev != NULL) &&
             ((node->prev->type == XML_ELEMENT_NODE) ||
	      (node->prev->type == XML_TEXT_NODE) ||
	      (node->prev->type == XML_COMMENT_NODE) ||
	      (node->prev->type == XML_PI_NODE)))
        result = xmlGetLineNoInternal(node->prev, depth + 1);
    else if ((node->parent != NULL) &&
             (node->parent->type == XML_ELEMENT_NODE))
        result = xmlGetLineNoInternal(node->parent, depth + 1);

    return result;
}